

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O0

void __thiscall WalkerManager::GenNewWaler(WalkerManager *this)

{
  element_type *peVar1;
  vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_> *in_RDI;
  shared_ptr<MWakler> walker;
  shared_ptr<MWakler> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar2;
  value_type *pvVar3;
  shared_ptr<MWakler> *walker_00;
  shared_ptr<MWakler> local_28;
  value_type local_18;
  
  pvVar3 = &local_18;
  std::make_shared<MWakler>();
  walker_00 = &local_28;
  std::shared_ptr<MWakler>::shared_ptr
            ((shared_ptr<MWakler> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  UpdateRandSpeed(walker_00,(float)((ulong)pvVar3 >> 0x20),SUB84(pvVar3,0));
  std::shared_ptr<MWakler>::~shared_ptr((shared_ptr<MWakler> *)0x12fa37);
  iVar2 = *(int *)&in_RDI[1].
                   super__Vector_base<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  *(int *)&in_RDI[1].
           super__Vector_base<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>.
           _M_impl.super__Vector_impl_data._M_start = iVar2 + 1;
  pvVar3 = &local_18;
  peVar1 = std::__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x12fa57);
  peVar1->idx = iVar2;
  std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>::push_back
            (in_RDI,pvVar3);
  std::shared_ptr<MWakler>::~shared_ptr((shared_ptr<MWakler> *)0x12fa78);
  return;
}

Assistant:

void GenNewWaler()
    {
        std::shared_ptr<MWakler> walker = std::make_shared<MWakler>();
        UpdateRandSpeed(walker);
        walker->idx = nextID++;

        walkers.push_back(walker);
    }